

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_local_time_abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,
          local_time_type *t,bool has_seconds,size_t subsec_prec)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  detail adStack_378 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string subsec_str;
  ostringstream oss;
  ostringstream subsec;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostringstream *)&oss,0x30);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  std::ostream::operator<<(poVar1,(uint)t->hour);
  std::operator<<((ostream *)&oss,':');
  poVar1 = std::operator<<(&oss,0x30);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  std::ostream::operator<<(poVar1,(uint)t->minute);
  if (has_seconds) {
    std::operator<<((ostream *)&oss,':');
    poVar1 = std::operator<<(&oss,0x30);
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
    std::ostream::operator<<(poVar1,(uint)t->second);
    if (subsec_prec != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&subsec);
      poVar1 = std::operator<<(&subsec,0x30);
      *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 3;
      std::ostream::operator<<(poVar1,(uint)t->millisecond);
      poVar1 = std::operator<<(&subsec,0x30);
      *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 3;
      std::ostream::operator<<(poVar1,(uint)t->microsecond);
      poVar1 = std::operator<<(&subsec,0x30);
      *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 3;
      std::ostream::operator<<(poVar1,(uint)t->nanosecond);
      std::__cxx11::stringbuf::str();
      poVar1 = std::operator<<((ostream *)&oss,'.');
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subsec_str,0,
                 subsec_prec);
      std::operator<<(poVar1,(string *)&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&subsec_str);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&subsec);
    }
  }
  std::__cxx11::stringbuf::str();
  string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
            (__return_storage_ptr__,adStack_378,s);
  std::__cxx11::string::~string((string *)adStack_378);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

string_type format_local_time(const local_time_type& t, const bool has_seconds, const std::size_t subsec_prec) // {{{
    {
        std::ostringstream oss;
        oss << std::setfill('0') << std::setw(2) << static_cast<int>(t.hour);
        oss << ':';
        oss << std::setfill('0') << std::setw(2) << static_cast<int>(t.minute);
        if(has_seconds)
        {
            oss << ':';
            oss << std::setfill('0') << std::setw(2) << static_cast<int>(t.second);
            if(subsec_prec != 0)
            {
                std::ostringstream subsec;
                subsec << std::setfill('0') << std::setw(3) << static_cast<int>(t.millisecond);
                subsec << std::setfill('0') << std::setw(3) << static_cast<int>(t.microsecond);
                subsec << std::setfill('0') << std::setw(3) << static_cast<int>(t.nanosecond);
                std::string subsec_str = subsec.str();
                oss << '.' << subsec_str.substr(0, subsec_prec);
            }
        }
        return string_conv<string_type>(oss.str());
    }